

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ma.c
# Opt level: O0

Boolean ad_big_enough(AD *ad,Pointer ar)

{
  ulong uVar1;
  AR *in_RSI;
  Pointer in_RDI;
  ulongi nbytes;
  Pointer client_space;
  ulong local_28;
  Pointer local_20;
  AD *in_stack_fffffffffffffff8;
  
  balloc_after(in_RSI,in_RDI,&local_20,&local_28);
  uVar1 = *(ulong *)(in_RDI + 0x38);
  if (local_28 <= uVar1) {
    block_split(in_stack_fffffffffffffff8,(ulongi)in_RDI,(Boolean)in_RSI);
    *(Pointer *)(in_RDI + 0x30) = local_20;
  }
  return (ulong)(local_28 <= uVar1);
}

Assistant:

private Boolean ad_big_enough(ad, ar)
    AD        *ad;        /* the AD to test */
    Pointer    ar;        /* allocation request */
{
    Pointer    client_space;    /* location of client_space */
    ulongi    nbytes;        /* length of block for ar */

    /* perform trial allocation to determine size */
    balloc_after((AR *)ar, (Pointer)ad, &client_space, &nbytes);

    if (nbytes <= ad->nbytes)
    {
        /* ad is big enough; split block if necessary */
        (void)block_split(ad, nbytes, MA_TRUE);

        /* set fields appropriately */
        ad->client_space = client_space;

        /* success */
        return MA_TRUE;
    }
    else
        /* ad is not big enough */
        return MA_FALSE;
}